

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerSRGBDecodeCase::test
          (SamplerSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  bool bVar2;
  GLenum GVar3;
  TesterType TVar4;
  GLfloat decodeFloat;
  GLint decodeInt;
  ScopedLogSection section;
  ScopedLogSection section_1;
  allocator<char> local_e9;
  GLfloat local_e8;
  GLuint local_e4;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  ScopedLogSection local_40;
  code *local_38;
  GLenum local_30;
  
  TVar4 = (this->super_SamplerTest).m_tester;
  bVar2 = isPureIntTester(TVar4);
  if (!bVar2) {
    bVar2 = isPureUintTester(TVar4);
    if (!bVar2) {
      pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Initial",(allocator<char> *)&local_80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Initial",(allocator<char> *)&local_60);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_a0,pTVar1,&local_c0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 0x8a49,(this->super_SamplerTest).m_type);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_a0);
    }
  }
  pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Toggle",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Toggle",(allocator<char> *)&local_80);
  tcu::ScopedLogSection::ScopedLogSection(&local_40,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  local_e4 = 0x8a49;
  local_e8 = 35401.0;
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e9);
    local_38 = glu::getErrorName;
    local_30 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+(&local_a0,&local_80,&local_60);
    std::operator+(&local_e0,&local_a0,": ");
    std::operator+(&local_c0,&local_e0,"set state");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameteriv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
             (GLint *)&local_e4);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e9);
    local_38 = glu::getErrorName;
    local_30 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+(&local_a0,&local_80,&local_60);
    std::operator+(&local_e0,&local_a0,": ");
    std::operator+(&local_c0,&local_e0,"set state");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterf
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,35402.0);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e9);
    local_38 = glu::getErrorName;
    local_30 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+(&local_a0,&local_80,&local_60);
    std::operator+(&local_e0,&local_a0,": ");
    std::operator+(&local_c0,&local_e0,"set state");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterfv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_e8);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Got Error ",&local_e9);
    local_38 = glu::getErrorName;
    local_30 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
    std::operator+(&local_a0,&local_80,&local_60);
    std::operator+(&local_e0,&local_a0,": ");
    std::operator+(&local_c0,&local_e0,"set state");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_40);
  TVar4 = (this->super_SamplerTest).m_tester;
  bVar2 = isPureIntTester(TVar4);
  if (bVar2) {
    local_40.m_log._0_4_ = 0x8a4a;
    local_e4 = 0x8a49;
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&local_40);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Got Error ",(allocator<char> *)&local_e8);
      local_38 = glu::getErrorName;
      local_30 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
      std::operator+(&local_a0,&local_80,&local_60);
      std::operator+(&local_e0,&local_a0,": ");
      std::operator+(&local_c0,&local_e0,"glSamplerParameterIiv");
      tcu::ResultCollector::fail(result,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a
               ,(this->super_SamplerTest).m_type);
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&local_e4);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Got Error ",(allocator<char> *)&local_e8);
      local_38 = glu::getErrorName;
      local_30 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
      std::operator+(&local_a0,&local_80,&local_60);
      std::operator+(&local_e0,&local_a0,": ");
      std::operator+(&local_c0,&local_e0,"glSamplerParameterIiv");
      tcu::ResultCollector::fail(result,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
    TVar4 = (this->super_SamplerTest).m_tester;
  }
  bVar2 = isPureUintTester(TVar4);
  if (bVar2) {
    local_40.m_log._0_4_ = 0x8a4a;
    local_e4 = 0x8a49;
    glu::CallLogWrapper::glSamplerParameterIuiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLuint *)&local_40);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Got Error ",(allocator<char> *)&local_e8);
      local_38 = glu::getErrorName;
      local_30 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
      std::operator+(&local_a0,&local_80,&local_60);
      std::operator+(&local_e0,&local_a0,": ");
      std::operator+(&local_c0,&local_e0,"glSamplerParameterIuiv");
      tcu::ResultCollector::fail(result,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a
               ,(this->super_SamplerTest).m_type);
    glu::CallLogWrapper::glSamplerParameterIuiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_e4);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Got Error ",(allocator<char> *)&local_e8);
      local_38 = glu::getErrorName;
      local_30 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_38);
      std::operator+(&local_a0,&local_80,&local_60);
      std::operator+(&local_e0,&local_a0,": ");
      std::operator+(&local_c0,&local_e0,"glSamplerParameterIuiv");
      tcu::ResultCollector::fail(result,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
  }
  return;
}

Assistant:

void SamplerSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glSamplerParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glSamplerParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}